

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O1

void do_steal(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  short sVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CClass *pCVar9;
  char *pcVar10;
  CHAR_DATA *victim;
  OBJ_DATA *obj;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  char buf [4608];
  char arg1 [4608];
  char arg2 [4608];
  
  iVar5 = get_skill(ch,(int)gsn_steal);
  if (iVar5 == 0) {
LAB_002651f8:
    send_to_char("Huh?\n\r",ch);
    return;
  }
  sVar2 = ch->level;
  lVar12 = (long)gsn_steal;
  pCVar9 = ch->my_class;
  if ((pCVar9 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar9 = ch->pIndexData->my_class, pCVar9 == (CClass *)0x0)))) {
    pCVar9 = CClass::GetClass(0);
  }
  iVar5 = CClass::GetIndex(pCVar9);
  if (sVar2 < *(short *)(lVar12 * 0x60 + 0x45a788 + (long)iVar5 * 2)) goto LAB_002651f8;
  pcVar10 = one_argument(argument,arg1);
  one_argument(pcVar10,arg2);
  if ((arg1[0] == '\0') || (arg2[0] == '\0')) {
    pcVar10 = "Steal what from whom?\n\r";
LAB_002652a0:
    send_to_char(pcVar10,ch);
    return;
  }
  victim = get_char_room(ch,arg2);
  if (victim == (CHAR_DATA *)0x0) {
    pcVar10 = "They aren\'t here.\n\r";
    goto LAB_002652a0;
  }
  if (victim == ch) {
    pcVar10 = "That\'s pointless.\n\r";
    goto LAB_002652a0;
  }
  bVar4 = is_safe(ch,victim);
  if (bVar4) {
    return;
  }
  if (victim->fighting != (CHAR_DATA *)0x0) {
    pcVar10 = "You can\'t get close enough in the fray!\n\r";
    goto LAB_002652a0;
  }
  bVar4 = is_cabal_guard(victim);
  if (bVar4) {
    pcVar10 = "You can\'t do that.\n\r";
    goto LAB_002652a0;
  }
  check_keen_vision(ch,victim);
  WAIT_STATE(ch,(int)skill_table[gsn_steal].beats);
  iVar6 = get_skill(ch,(int)gsn_steal);
  iVar7 = get_curr_stat(ch,3);
  bVar4 = is_npc(victim);
  iVar5 = ((int)victim->level - (int)ch->level) * -5;
  if (!bVar4) {
    iVar5 = ((int)ch->level - (int)victim->level) * 2;
  }
  bVar4 = can_see(victim,ch);
  iVar3 = iVar5 + 5;
  if (bVar4) {
    iVar3 = iVar5 + -0x19;
  }
  iVar3 = iVar3 + iVar7 * 5 + iVar6 / 2;
  bVar4 = is_affected_by(ch,0xf);
  iVar5 = iVar3 + -0x6e;
  if (bVar4) {
    iVar5 = iVar3 + -100;
  }
  bVar4 = is_awake(victim);
  if (bVar4) {
    iVar6 = get_curr_stat(victim,3);
    iVar5 = iVar5 + iVar6 * -2 + 0x1e;
  }
  else {
    iVar5 = iVar5 + 0x19;
  }
  pCVar9 = char_data::Class(ch);
  bVar4 = RString::operator==(&pCVar9->name,"anti-paladin");
  iVar6 = 0x28;
  if (0x28 < iVar5) {
    iVar6 = iVar5;
  }
  if (!bVar4) {
    iVar6 = iVar5;
  }
  bVar4 = is_npc(victim);
  if ((bVar4) && (victim->pIndexData->pShop != (SHOP_DATA *)0x0)) {
    iVar6 = 0;
  }
  iVar7 = get_trust(ch);
  iVar5 = 100;
  if (iVar7 < 0x3b) {
    iVar5 = iVar6;
  }
  iVar6 = number_percent();
  if (iVar6 <= iVar5) {
    bVar4 = str_cmp(arg1,"coin");
    if (((bVar4) && (bVar4 = str_cmp(arg1,"coins"), bVar4)) && (bVar4 = str_cmp(arg1,"gold"), bVar4)
       ) {
      obj = get_obj_carry(victim,arg1,ch);
      if (obj == (OBJ_DATA *)0x0) {
        pcVar10 = "You can\'t find it.\n\r";
      }
      else {
        bVar4 = can_drop_obj(ch,obj);
        if ((bVar4) && ((obj->extra_flags[0] & 0x2000) == 0)) {
          sVar2 = ch->carry_number;
          iVar5 = get_obj_number(obj);
          iVar6 = can_carry_n(ch);
          if (iVar6 < iVar5 + sVar2) {
            pcVar10 = "You have your hands full.\n\r";
          }
          else {
            sVar2 = ch->carry_weight;
            iVar5 = get_obj_weight(obj);
            iVar6 = can_carry_w(ch);
            if (iVar5 + sVar2 <= iVar6) {
              obj_from_char(obj);
              obj_to_char(obj,ch);
              check_improve(ch,(int)gsn_steal,true,2);
              bVar4 = is_affected(victim,(int)gsn_accumulate_heat);
              if (bVar4) {
                act("As you grab for $p you are burned!",ch,obj,victim,3);
                act("As $n grabs for $p, $e is burned!",ch,obj,victim,2);
                iVar5 = dice(4,6);
                damage_new(victim,ch,iVar5,(int)gsn_burning_hands,4,true,false,0,1,(char *)0x0);
              }
              act("You steal $p from $N.",ch,obj,victim,3);
              bVar4 = is_npc(ch);
              if (bVar4) {
                return;
              }
              bVar4 = is_npc(victim);
              if (bVar4) {
                return;
              }
              bVar4 = is_immortal(ch);
              if (bVar4) {
                return;
              }
              bVar4 = is_immortal(victim);
              if (bVar4) {
                return;
              }
              CSQLInterface::Insert
                        (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'%s\',1)",
                         ch->true_name,victim->true_name,obj->short_descr);
              return;
            }
            pcVar10 = "You can\'t carry that much weight.\n\r";
          }
        }
        else {
          pcVar10 = "You can\'t pry it away.\n\r";
        }
      }
    }
    else {
      uVar13 = victim->gold;
      if (100 < (long)uVar13) {
        uVar8 = number_range((int)(uVar13 >> 3),(int)uVar13);
        uVar13 = (ulong)uVar8;
      }
      if (0 < (int)uVar13) {
        ch->gold = ch->gold + (uVar13 & 0xffffffff);
        victim->gold = victim->gold - (uVar13 & 0xffffffff);
        sprintf(buf,"Bingo!  You got %d gold coins.\n\r",uVar13 & 0xffffffff);
        bVar4 = is_npc(ch);
        if (((!bVar4) && (bVar4 = is_npc(victim), !bVar4)) &&
           ((bVar4 = is_immortal(ch), !bVar4 && (bVar4 = is_immortal(victim), !bVar4)))) {
          CSQLInterface::Insert
                    (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'%d\',1)",
                     ch->true_name,victim->true_name,uVar13 & 0xffffffff);
        }
        send_to_char(buf,ch);
        check_improve(ch,(int)gsn_steal,true,2);
        bVar4 = is_npc(victim);
        if (!bVar4) {
          return;
        }
        if (victim->stolen_from != false) {
          return;
        }
        victim->stolen_from = true;
        return;
      }
      pcVar10 = "You couldn\'t get any coins.\n\r";
    }
    goto LAB_002652a0;
  }
  send_to_char("Oops.\n\r",ch);
  switchD_002e4026::default(ch,(int)gsn_sneak);
  pbVar1 = (byte *)((long)ch->affected_by + 1);
  *pbVar1 = *pbVar1 & 0x7f;
  check_improve(ch,(int)gsn_steal,false,2);
  act("$n tried to steal from you.\n\r",ch,(void *)0x0,victim,2);
  act("$n tried to steal from $N.\n\r",ch,(void *)0x0,victim,1);
  bVar4 = is_npc(ch);
  if ((((!bVar4) && (bVar4 = is_npc(victim), !bVar4)) && (bVar4 = is_immortal(ch), !bVar4)) &&
     (bVar4 = is_immortal(victim), !bVar4)) {
    CSQLInterface::Insert
              (&RS.SQL,"theft(ch, victim, obj, success) values(\'%s\',\'%s\',\'none\',0)",
               ch->true_name,victim->true_name);
  }
  iVar5 = number_range(0,3);
  switch(iVar5) {
  case 0:
    pcVar10 = pers(ch,victim);
    pcVar11 = "%s is a lousy thief!";
    break;
  case 1:
    pcVar10 = pers(ch,victim);
    pcVar11 = "his";
    if (ch->sex == 2) {
      pcVar11 = "her";
    }
    sprintf(buf,"%s couldn\'t rob %s way out of a paper bag!",pcVar10,pcVar11);
    goto switchD_00265503_default;
  case 2:
    pcVar10 = pers(ch,victim);
    pcVar11 = "%s tried to rob me!";
    break;
  case 3:
    pcVar10 = pers(ch,victim);
    pcVar11 = "Keep your hands out of there, %s!";
    break;
  default:
    goto switchD_00265503_default;
  }
  sprintf(buf,pcVar11,pcVar10);
switchD_00265503_default:
  bVar4 = is_awake(victim);
  if ((bVar4) && (bVar4 = is_npc(victim), !bVar4)) {
    do_yell(victim,buf);
  }
  bVar4 = is_npc(ch);
  if (!bVar4) {
    bVar4 = is_npc(victim);
    if ((bVar4) && (bVar4 = is_awake(victim), bVar4)) {
      multi_hit(victim,ch,-1);
    }
    else {
      sprintf(buf,"$N tried to steal from %s.",victim->name);
      wiznet(buf,ch,(OBJ_DATA *)0x0,8,0,0);
    }
  }
  return;
}

Assistant:

void do_steal(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	int chance;
	char query[MSL];

	if (get_skill(ch, gsn_steal) == 0 || ch->level < skill_table[gsn_steal].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Steal what from whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg2);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's pointless.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (victim->fighting != nullptr)
	{
		send_to_char("You can't get close enough in the fray!\n\r", ch);
		return;
	}

	if (is_cabal_guard(victim))
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	check_keen_vision(ch, victim);

	WAIT_STATE(ch, skill_table[gsn_steal].beats);

	chance = get_skill(ch, gsn_steal);
	chance /= 2;
	chance += 5 * (get_curr_stat(ch, STAT_DEX) - 20);

	if (is_npc(victim))
		chance -= 5 * (victim->level - ch->level);
	else
		chance -= 2 * (victim->level - ch->level);

	if (can_see(victim, ch))
		chance -= 25;
	else
		chance += 5;

	if (!is_affected_by(ch, AFF_SNEAK))
		chance -= 10;

	if (!is_awake(victim))
		chance += 25;
	else
		chance -= 2 * (get_curr_stat(victim, STAT_DEX) - 15);

	if (ch->Class()->name == "anti-paladin")
		chance = std::max(40, chance);

	if (is_npc(victim) && victim->pIndexData->pShop)
		chance = 0;

	if (get_trust(ch) >= 59)
		chance = 100;

	if (number_percent() > chance)
	{
		/*
		 * Failure.
		 */
		send_to_char("Oops.\n\r", ch);

		affect_strip(ch, gsn_sneak);

		REMOVE_BIT(ch->affected_by, AFF_SNEAK);

		check_improve(ch, gsn_steal, false, 2);

		act("$n tried to steal from you.\n\r", ch, nullptr, victim, TO_VICT);
		act("$n tried to steal from $N.\n\r", ch, nullptr, victim, TO_NOTVICT);

		if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
			RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','none',0)", ch->true_name, victim->true_name);

		switch (number_range(0, 3))
		{
			case 0:
				sprintf(buf, "%s is a lousy thief!", pers(ch, victim));
				break;
			case 1:
				sprintf(buf, "%s couldn't rob %s way out of a paper bag!",
					pers(ch, victim), 
					(ch->sex == 2) ? "her" : "his");
				break;
			case 2:
				sprintf(buf, "%s tried to rob me!", pers(ch, victim));
				break;
			case 3:
				sprintf(buf, "Keep your hands out of there, %s!", pers(ch, victim));
				break;
		}

		if (is_awake(victim) && !is_npc(victim))
			do_yell(victim, buf);

		if (!is_npc(ch))
		{
			if (is_npc(victim) && is_awake(victim))
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
			}
			else
			{
				sprintf(buf, "$N tried to steal from %s.", victim->name);
				wiznet(buf, ch, nullptr, WIZ_FLAGS, 0, 0);
			}
		}

		return;
	}

	if (!str_cmp(arg1, "coin") || !str_cmp(arg1, "coins") || !str_cmp(arg1, "gold"))
	{
		int gold;

		if (victim->gold <= 100)
			gold = victim->gold;
		else
			gold = number_range((int)(victim->gold / 8), victim->gold);

		if (gold <= 0)
		{
			send_to_char("You couldn't get any coins.\n\r", ch);
			return;
		}

		ch->gold += gold;
		victim->gold -= gold;

		sprintf(buf, "Bingo!  You got %d gold coins.\n\r", gold);

		if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
		{
			RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','%d',1)",
				ch->true_name,
				victim->true_name,
				gold);
		}

		send_to_char(buf, ch);
		check_improve(ch, gsn_steal, true, 2);

		if (is_npc(victim) && !victim->stolen_from)
			victim->stolen_from = true;

		return;
	}

	obj = get_obj_carry(victim, arg1, ch);

	if (obj == nullptr)
	{
		send_to_char("You can't find it.\n\r", ch);
		return;
	}

	if (!can_drop_obj(ch, obj) || IS_SET(obj->extra_flags, ITEM_INVENTORY))
	{
		send_to_char("You can't pry it away.\n\r", ch);
		return;
	}

	if (ch->carry_number + get_obj_number(obj) > can_carry_n(ch))
	{
		send_to_char("You have your hands full.\n\r", ch);
		return;
	}

	if (ch->carry_weight + get_obj_weight(obj) > can_carry_w(ch))
	{
		send_to_char("You can't carry that much weight.\n\r", ch);
		return;
	}

	obj_from_char(obj);
	obj_to_char(obj, ch);
	check_improve(ch, gsn_steal, true, 2);

	if (is_affected(victim, gsn_accumulate_heat))
	{
		act("As you grab for $p you are burned!", ch, obj, victim, TO_CHAR);
		act("As $n grabs for $p, $e is burned!", ch, obj, victim, TO_VICT);
		damage_new(victim, ch, dice(4, 6), gsn_burning_hands, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	}

	act("You steal $p from $N.", ch, obj, victim, TO_CHAR);

	if (!is_npc(ch) && !is_npc(victim) && !is_immortal(ch) && !is_immortal(victim))
	{
		RS.SQL.Insert("theft(ch, victim, obj, success) values('%s','%s','%s',1)",
			ch->true_name,
			victim->true_name,
			obj->short_descr);
	}
}